

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_util.c
# Opt level: O0

char * cmime_util_get_mimetype(char *filename)

{
  __ssize_t _Var1;
  size_t sVar2;
  char *__dest;
  char *__s;
  char *retval;
  char *command;
  FILE *fh;
  size_t st;
  char *buf;
  char *filename_local;
  
  st = 0;
  fh = (FILE *)0x0;
  command = (char *)0x0;
  retval = (char *)0x0;
  buf = filename;
  if (filename != (char *)0x0) {
    asprintf(&retval,"%s \'%s\'","/usr/bin/file -b --mime",filename);
    command = (char *)popen(retval,"r");
    if ((FILE *)command == (FILE *)0x0) {
      free(retval);
      filename_local = (char *)0x0;
    }
    else {
      free(retval);
      _Var1 = getline((char **)&st,(size_t *)&fh,(FILE *)command);
      if (_Var1 < 1) {
        pclose((FILE *)command);
        filename_local = (char *)0x0;
      }
      else {
        sVar2 = strlen((char *)st);
        __dest = (char *)calloc(sVar2 + 1,1);
        __s = cmime_string_chomp((char *)st);
        st = (size_t)__s;
        sVar2 = strlen(__s);
        strncpy(__dest,__s,sVar2);
        sVar2 = strlen(__dest);
        __dest[sVar2] = '\0';
        free((void *)st);
        pclose((FILE *)command);
        filename_local = __dest;
      }
    }
    return filename_local;
  }
  __assert_fail("filename",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_util.c"
                ,0x3d,"char *cmime_util_get_mimetype(const char *)");
}

Assistant:

char *cmime_util_get_mimetype(const char *filename) {
    char *buf = NULL;
    size_t st = 0;
    FILE *fh = NULL;
    char *command = NULL;
    char *retval = NULL;
    
    assert(filename);
    
    /* build up the command string */
    asprintf(&command,"%s '%s'",FILE_EXECUTABLE,filename);

    /* open the pipe and try to read command output */
    fh = popen(command, "r");
    if(fh == NULL) {
        free(command);
        return(NULL);
    }
    free(command);
    if(getline(&buf,&st,fh) > 0) {
        /* copy command output from static buffer into string */
        retval =  (char *)calloc(strlen(buf) + sizeof(char), sizeof(char));
        buf = cmime_string_chomp(buf);
        strncpy(retval, buf, strlen(buf));
        retval[strlen(retval)] = '\0';
        free(buf);
        pclose(fh);
        return(retval);
    } else {
        pclose(fh);
        return(NULL);
    }
}